

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

void MpiDestroyReader(CP_Services Svcs,DP_RS_Stream RS_Stream_v)

{
  int iVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int i;
  int CohortSize;
  MpiStreamRD StreamRS;
  int local_20;
  
  (*(code *)*in_RDI)(*in_RSI,5,"MpiDestroyReader invoked [rank:%d]\n",*(undefined4 *)(in_RSI + 1));
  iVar1 = *(int *)(in_RSI + 3);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    if (*(undefined **)(in_RSI[0x11] + (long)local_20 * 8) != &ompi_mpi_comm_null) {
      MPI_Comm_disconnect(in_RSI[0x11] + (long)local_20 * 8);
    }
  }
  free((void *)in_RSI[0x11]);
  free((void *)in_RSI[0x10]);
  free(in_RSI);
  return;
}

Assistant:

static void MpiDestroyReader(CP_Services Svcs, DP_RS_Stream RS_Stream_v)
{
    MpiStreamRD StreamRS = (MpiStreamRD)RS_Stream_v;

    Svcs->verbose(StreamRS->Stream.CP_Stream, DPTraceVerbose,
                  "MpiDestroyReader invoked [rank:%d]\n", StreamRS->Stream.Rank);

    const int CohortSize = StreamRS->Link.CohortSize;

    for (int i = 0; i < CohortSize; i++)
    {
        if (StreamRS->CohortMpiComms[i] != MPI_COMM_NULL)
        {
            MPI_Comm_disconnect(&StreamRS->CohortMpiComms[i]);
        }
    }
    free(StreamRS->CohortMpiComms);
    free(StreamRS->CohortWriterInfo);
    free(StreamRS);
}